

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::StructColumnData::InitializeColumn
          (StructColumnData *this,PersistentColumnData *column_data,BaseStatistics *target_stats)

{
  reference pvVar1;
  BaseStatistics *pBVar2;
  reference this_00;
  pointer pCVar3;
  ulong i;
  
  i = 0;
  pvVar1 = vector<duckdb::PersistentColumnData,_true>::get<true>(&column_data->child_columns,0);
  ColumnData::InitializeColumn(&(this->validity).super_ColumnData,pvVar1,target_stats);
  while (i < (ulong)((long)(this->sub_columns).
                           super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->sub_columns).
                           super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pBVar2 = StructStats::GetChildStats(target_stats,i);
    this_00 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
              ::get<true>(&this->sub_columns,i);
    pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(this_00);
    i = i + 1;
    pvVar1 = vector<duckdb::PersistentColumnData,_true>::get<true>(&column_data->child_columns,i);
    (*pCVar3->_vptr_ColumnData[0x20])(pCVar3,pvVar1,pBVar2);
  }
  LOCK();
  (this->super_ColumnData).count.super___atomic_base<unsigned_long>._M_i =
       (this->validity).super_ColumnData.count.super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  return;
}

Assistant:

void StructColumnData::InitializeColumn(PersistentColumnData &column_data, BaseStatistics &target_stats) {
	validity.InitializeColumn(column_data.child_columns[0], target_stats);
	for (idx_t c_idx = 0; c_idx < sub_columns.size(); c_idx++) {
		auto &child_stats = StructStats::GetChildStats(target_stats, c_idx);
		sub_columns[c_idx]->InitializeColumn(column_data.child_columns[c_idx + 1], child_stats);
	}
	this->count = validity.count.load();
}